

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  Ch *pCVar4;
  size_t sVar5;
  ostream *poVar6;
  memory_pool<char> *pmVar7;
  char *__s;
  char *pcVar8;
  long lVar9;
  long *plVar10;
  initializer_list<Person> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>
  __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_09;
  initializer_list<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  __l_10;
  Customize c;
  Customize c2;
  string xml_str;
  AddressBook ab;
  json_oarchive json_oa;
  AddressBook ab2;
  AddressBook ab3;
  json_iarchive json_ia;
  xml_oarchive xml_oa;
  xml_iarchive xml_ia;
  allocator_type aStack_20545;
  allocator_type aStack_20544;
  allocator_type aStack_20543;
  allocator_type aStack_20542;
  allocator_type aStack_20541;
  allocator_type aStack_20540;
  allocator_type aStack_2053f;
  allocator_type aStack_2053e;
  allocator_type aStack_2053d;
  allocator_type aStack_2053c;
  allocator_type aStack_2053b;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  lStack_2053a;
  allocator_type aaStack_20539 [9];
  _Alloc_hider _Stack_20530;
  _Alloc_hider _Stack_20528;
  undefined1 auStack_20520 [24];
  _Alloc_hider _Stack_20508;
  _Alloc_hider _Stack_20500;
  undefined1 auStack_204f8 [24];
  vector<int,_std::allocator<int>_> vStack_204e0;
  undefined1 auStack_204c0 [24];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  _Stack_204a8;
  bool bStack_20488;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  _Stack_20480;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  vStack_20450;
  undefined1 auStack_20438 [32];
  char *pcStack_20418;
  size_t sStack_20410;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGStack_20408;
  Stack<rapidjson::CrtAllocator> SStack_20400;
  int iStack_203d0;
  bool bStack_203cc;
  undefined1 auStack_203c8 [24];
  undefined1 auStack_203b0 [32];
  bool bStack_20390;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  _Stack_20388;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  vStack_20358;
  long lStack_20340;
  AddressBook AStack_20338;
  undefined1 auStack_202b0 [48];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  avStack_20280 [2];
  _Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
  _Stack_20250;
  int aiStack_20200 [18];
  undefined1 auStack_201b8 [40];
  undefined1 *puStack_20190;
  xml_node<char> *pxStack_20188;
  undefined1 auStack_20180 [8];
  xml_attribute<char> *pxStack_20178;
  undefined4 uStack_20170;
  memory_pool<char> *apmStack_20168 [2];
  memory_pool<char> mStack_20158;
  _Alloc_hider _Stack_10128;
  size_type sStack_10120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_10118;
  undefined1 auStack_10108 [96];
  undefined1 auStack_100a8 [96];
  long alStack_10048 [8185];
  _Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
  local_80;
  
  auStack_201b8._0_8_ = auStack_201b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_201b8,"aaaaaaa","");
  auStack_201b8._32_4_ = 0xc;
  puStack_20190 = auStack_20180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_20190,"qwasasdq","");
  uStack_20170 = 0x573b;
  pmVar7 = &mStack_20158;
  apmStack_20168[0] = pmVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)apmStack_20168,"12qweqweqweqwe","");
  mStack_20158.m_end = (char *)CONCAT44(mStack_20158.m_end._4_4_,0x1e0f3);
  __l._M_len = 3;
  __l._M_array = (iterator)auStack_201b8;
  std::vector<Person,_std::allocator<Person>_>::vector
            ((vector<Person,_std::allocator<Person>_> *)auStack_204c0,__l,aaStack_20539);
  _Stack_204a8._M_value._M_dataplus._M_p = (_Alloc_hider)(auStack_204c0 + 0x28);
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_204c0 + 0x18),"opt string","");
  bStack_20488 = true;
  auStack_20438._0_8_ = auStack_20438 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_20438,"a","");
  pcStack_20418 = (char *)CONCAT44(pcStack_20418._4_4_,1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  ::pair<const_char_(&)[2],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
              *)auStack_10108,(char (*) [2])0x1170b5,(Person *)auStack_20438);
  _Stack_20530._M_p = auStack_20520;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_20530,"b","");
  auStack_20520._16_4_ = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  ::pair<const_char_(&)[2],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
              *)(auStack_10108 + 0x48),(char (*) [2])0x11a44c,(Person *)&_Stack_20530);
  _Stack_20508._M_p = auStack_204f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_20508,"c","");
  auStack_204f8._16_4_ = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
  ::pair<const_char_(&)[2],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
              *)(auStack_100a8 + 0x30),(char (*) [2])"c",(Person *)&_Stack_20508);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)auStack_10108;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
         *)(auStack_204c0 + 0x40),__l_00,&lStack_2053a,&aStack_2053b);
  aiStack_20200[0xf] = 1;
  aiStack_20200[0x10] = 2;
  aiStack_20200[0x11] = 3;
  __l_01._M_len = 3;
  __l_01._M_array = aiStack_20200 + 0xf;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_203c8,__l_01,&aStack_2053c);
  aiStack_20200[0xc] = 4;
  aiStack_20200[0xd] = 5;
  aiStack_20200[0xe] = 6;
  __l_02._M_len = 3;
  __l_02._M_array = aiStack_20200 + 0xc;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_203b0,__l_02,&aStack_2053d);
  aiStack_20200[9] = 7;
  aiStack_20200[10] = 8;
  aiStack_20200[0xb] = 9;
  __l_03._M_len = 3;
  __l_03._M_array = aiStack_20200 + 9;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(auStack_203b0 + 0x18),__l_03,&aStack_2053e);
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)auStack_203c8;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)auStack_202b0,__l_04,&aStack_2053f);
  aiStack_20200[6] = 0xb;
  aiStack_20200[7] = 0xc;
  aiStack_20200[8] = 0xd;
  __l_05._M_len = 3;
  __l_05._M_array = aiStack_20200 + 6;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&AStack_20338,__l_05,&aStack_20540);
  aiStack_20200[3] = 0xe;
  aiStack_20200[4] = 0xf;
  aiStack_20200[5] = 0x10;
  __l_06._M_len = 3;
  __l_06._M_array = aiStack_20200 + 3;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&AStack_20338.opt,__l_06,&aStack_20541);
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&AStack_20338;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(auStack_202b0 + 0x18),__l_07,&aStack_20542);
  aiStack_20200[0] = 0x15;
  aiStack_20200[1] = 0x16;
  aiStack_20200[2] = 0x17;
  __l_08._M_len = 3;
  __l_08._M_array = aiStack_20200;
  std::vector<int,_std::allocator<int>_>::vector(&vStack_204e0,__l_08,&aStack_20543);
  __l_09._M_len = 1;
  __l_09._M_array = &vStack_204e0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(avStack_20280,__l_09,&aStack_20544);
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)auStack_202b0;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)(auStack_204c0 + 0x70),__l_10,&aStack_20545);
  lVar9 = 0x30;
  do {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(auStack_202b0 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if (vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar9 = 0x30;
  do {
    pvVar1 = *(void **)((long)&vStack_20358.
                               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar9);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_20340 + lVar9) - (long)pvVar1);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  lVar9 = 0x48;
  do {
    pvVar1 = *(void **)((long)&SStack_20400.stackEnd_ + lVar9);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&iStack_203d0 + lVar9) - (long)pvVar1);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  lVar9 = -0xd8;
  plVar10 = alStack_10048;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    if (plVar10 + -4 != (long *)plVar10[-6]) {
      operator_delete((long *)plVar10[-6],plVar10[-4] + 1);
    }
    plVar10 = plVar10 + -9;
    lVar9 = lVar9 + 0x48;
  } while (lVar9 != 0);
  if (_Stack_20508._M_p != auStack_204f8) {
    operator_delete(_Stack_20508._M_p,auStack_204f8._0_8_ + 1);
  }
  if (_Stack_20530._M_p != auStack_20520) {
    operator_delete(_Stack_20530._M_p,auStack_20520._0_8_ + 1);
  }
  if ((undefined1 *)auStack_20438._0_8_ != auStack_20438 + 0x10) {
    operator_delete((void *)auStack_20438._0_8_,auStack_20438._16_8_ + 1);
  }
  lVar9 = -0x78;
  do {
    if (pmVar7 != (memory_pool<char> *)pmVar7[-1].m_alloc_func) {
      operator_delete((memory_pool<char> *)pmVar7[-1].m_alloc_func,(ulong)(pmVar7->m_begin + 1));
    }
    pmVar7 = (memory_pool<char> *)(pmVar7[-1].m_static_memory + 0xffe8);
    lVar9 = lVar9 + 0x28;
  } while (lVar9 != 0);
  auStack_20438._16_8_ = 0;
  auStack_20438._24_8_ = 0;
  auStack_20438._0_8_ = (pointer)0x0;
  auStack_20438._8_8_ = (CrtAllocator *)0x0;
  pcStack_20418 = (char *)0x0;
  sStack_20410 = 0x100;
  pGStack_20408 = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x0;
  SStack_20400.allocator_ = (CrtAllocator *)0x0;
  SStack_20400.ownAllocator_ = (CrtAllocator *)0x0;
  SStack_20400.stack_ = (char *)0x0;
  SStack_20400.stackTop_ = (char *)0x0;
  SStack_20400.stackEnd_ = (char *)0x0;
  SStack_20400.initialCapacity_ = 0x200;
  iStack_203d0 = 0x144;
  bStack_203cc = false;
  serialization::serialize<serialization::json_oarchive,AddressBook>
            ((json_oarchive *)auStack_20438,(AddressBook *)auStack_204c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"json serilize result: ",0x16);
  pCVar4 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      auStack_20438);
  if (pCVar4 == (Ch *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x122118);
  }
  else {
    sVar5 = strlen(pCVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pCVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  _Stack_20388._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_20388._M_impl.super__Rb_tree_header._M_header;
  auStack_203c8._0_8_ = (pointer)0x0;
  auStack_203c8._8_8_ = (pointer)0x0;
  auStack_203c8._16_8_ = (pointer)0x0;
  bStack_20390 = false;
  _Stack_20388._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_20388._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_20388._M_impl.super__Rb_tree_header._M_node_count = 0;
  vStack_20358.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_20358.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_20358.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_20388._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_20388._M_impl.super__Rb_tree_header._M_header._M_left;
  serialization::json_iarchive::json_iarchive((json_iarchive *)auStack_202b0);
  pCVar4 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      auStack_20438);
  serialization::json_iarchive::load_data((json_iarchive *)auStack_202b0,pCVar4);
  serialization::json_iarchive::unserialize_start((json_iarchive *)auStack_202b0);
  serialization::json_iarchive::load_object_start((json_iarchive *)auStack_202b0);
  AddressBook::unserialize_impl<serialization::json_iarchive>
            ((AddressBook *)auStack_203c8,(json_iarchive *)auStack_202b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"json unserilize result: ",0x18);
  bVar2 = AddressBook::operator==((AddressBook *)auStack_204c0,(AddressBook *)auStack_203c8);
  __s = "fail";
  pcVar8 = "fail";
  if (bVar2) {
    pcVar8 = "success";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar8,(ulong)bVar2 * 3 + 4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  mStack_20158.m_end = (char *)&mStack_20158.m_alloc_func;
  auStack_201b8._32_8_ = (xml_node<char> *)0x0;
  auStack_201b8._0_8_ = (pointer)0x0;
  auStack_201b8._8_8_ = (char *)0x0;
  puStack_20190 = (undefined1 *)((ulong)puStack_20190 & 0xffffffff00000000);
  pxStack_20188 = (xml_node<char> *)0x0;
  pxStack_20178 = (xml_attribute<char> *)0x0;
  mStack_20158.m_begin = mStack_20158.m_static_memory;
  mStack_20158.m_alloc_func = (alloc_func *)0x0;
  mStack_20158.m_free_func = (free_func *)0x0;
  sStack_10120 = 0;
  aStack_10118._M_local_buf[0] = '\0';
  mStack_20158.m_ptr = mStack_20158.m_begin;
  _Stack_10128._M_p = (pointer)&aStack_10118;
  serialization::serialize<serialization::xml_oarchive,AddressBook>
            ((xml_oarchive *)auStack_201b8,(AddressBook *)auStack_204c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vStack_204e0,_Stack_10128._M_p,(allocator<char> *)auStack_10108);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"xml serilize result: ",0x15);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      (char *)vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                      (long)vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  AStack_20338.mapTest._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_20338.mapTest._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_20338.people.super__Vector_base<Person,_std::allocator<Person>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_20338.people.super__Vector_base<Person,_std::allocator<Person>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_20338.people.super__Vector_base<Person,_std::allocator<Person>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AStack_20338.opt.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  AStack_20338.mapTest._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_20338.mapTest._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_20338.mapTest._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_20338.vectorTest.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_20338.vectorTest.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_20338.vectorTest.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AStack_20338.mapTest._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_20338.mapTest._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  serialization::xml_iarchive::xml_iarchive((xml_iarchive *)auStack_10108);
  serialization::xml_iarchive::load_data
            ((xml_iarchive *)auStack_10108,
             (char *)vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start);
  serialization::xml_iarchive::unserialize_start((xml_iarchive *)auStack_10108);
  AddressBook::unserialize_impl<serialization::xml_iarchive>
            (&AStack_20338,(xml_iarchive *)auStack_10108);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"xml unserilize result: ",0x17);
  bVar2 = AddressBook::operator==((AddressBook *)auStack_204c0,&AStack_20338);
  pcVar8 = "fail";
  if (bVar2) {
    pcVar8 = "success";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar8,(ulong)bVar2 * 3 + 4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  _Stack_20530._M_p._0_4_ = 0x7b;
  _Stack_20528._M_p = auStack_20520 + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_20528,"456","");
  auStack_204f8._0_8_ = 0;
  auStack_204f8[8] = '\0';
  _Stack_20500._M_p = auStack_204f8 + 8;
  serialization::serialize<serialization::json_oarchive,Customize>
            ((json_oarchive *)auStack_20438,(Customize *)&_Stack_20530);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"customize json serilize result: ",0x20);
  pCVar4 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      auStack_20438);
  if (pCVar4 == (Ch *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x122118);
  }
  else {
    sVar5 = strlen(pCVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pCVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  pCVar4 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      auStack_20438);
  serialization::json_iarchive::load_data((json_iarchive *)auStack_202b0,pCVar4);
  serialization::json_iarchive::unserialize_start((json_iarchive *)auStack_202b0);
  serialization::json_iarchive::load_object_start((json_iarchive *)auStack_202b0);
  Customize::unserialize_impl<serialization::json_iarchive>
            ((Customize *)&_Stack_20508,(json_iarchive *)auStack_202b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"customize json unserilize result: ",0x22);
  if ((((int)_Stack_20530._M_p == (int)_Stack_20508._M_p) &&
      (auStack_20520._0_8_ == auStack_204f8._0_8_)) && (__s = "success", auStack_20520._0_8_ != 0))
  {
    iVar3 = bcmp(_Stack_20528._M_p,_Stack_20500._M_p,auStack_20520._0_8_);
    __s = "fail";
    if (iVar3 == 0) {
      __s = "success";
    }
  }
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  if (_Stack_20500._M_p != auStack_204f8 + 8) {
    operator_delete(_Stack_20500._M_p,CONCAT71(auStack_204f8._9_7_,auStack_204f8[8]) + 1);
  }
  if (_Stack_20528._M_p != auStack_20520 + 8) {
    operator_delete(_Stack_20528._M_p,auStack_20520._8_8_ + 1);
  }
  std::
  _Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  ~_Deque_base(&local_80);
  rapidxml::memory_pool<char>::clear((memory_pool<char> *)auStack_100a8);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&AStack_20338.vectorTest);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  ::~_Rb_tree(&AStack_20338.mapTest._M_t);
  if (AStack_20338.opt.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    AStack_20338.opt.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if (AStack_20338.opt.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p !=
        ((pointer)
        ((long)&AStack_20338.opt.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        + 0x10U))._M_p) {
      operator_delete((void *)AStack_20338.opt.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      AStack_20338.opt.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
  }
  std::vector<Person,_std::allocator<Person>_>::~vector(&AStack_20338.people);
  if ((pointer *)
      vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_204e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_10128._M_p != &aStack_10118) {
    operator_delete(_Stack_10128._M_p,
                    CONCAT71(aStack_10118._M_allocated_capacity._1_7_,aStack_10118._M_local_buf[0])
                    + 1);
  }
  rapidxml::memory_pool<char>::clear(&mStack_20158);
  std::
  _Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
  ::~_Deque_base(&_Stack_20250);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)auStack_202b0);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&vStack_20358);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  ::~_Rb_tree(&_Stack_20388);
  if (bStack_20390 == true) {
    bStack_20390 = false;
    if ((undefined1 *)auStack_203b0._0_8_ != auStack_203b0 + 0x10) {
      operator_delete((void *)auStack_203b0._0_8_,auStack_203b0._16_8_ + 1);
    }
  }
  std::vector<Person,_std::allocator<Person>_>::~vector
            ((vector<Person,_std::allocator<Person>_> *)auStack_203c8);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&SStack_20400);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)auStack_20438);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)(auStack_204c0 + 0x70));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
               *)(auStack_204c0 + 0x40));
  if (bStack_20488 == true) {
    bStack_20488 = false;
    if (_Stack_204a8._M_value._M_dataplus._M_p != (_Alloc_hider)(auStack_204c0 + 0x28)) {
      operator_delete((void *)_Stack_204a8._M_value._M_dataplus._M_p,_Stack_204a8._16_8_ + 1);
    }
  }
  std::vector<Person,_std::allocator<Person>_>::~vector
            ((vector<Person,_std::allocator<Person>_> *)auStack_204c0);
  return 0;
}

Assistant:

int main(int argc, char * argv[])
{
    try
    {
        AddressBook ab = {
            {
                {"aaaaaaa", 12},
                {"qwasasdq", 22331},
                {"12qweqweqweqwe", 123123}
            },
            "opt string",
            {
                {"a", {"a", 1} },
                {"b", {"b", 2} },
                {"c", {"c", 3} },
            },
            {
                { {1, 2, 3}, {4, 5, 6}, {7, 8, 9} },
                { {11, 12, 13}, {14, 15, 16} },
                { {21, 22, 23} },
            }
        };

        // json serialize
        serialization::json_oarchive json_oa;
        serialization::serialize(json_oa, ab);
        std::cout << "json serilize result: " << json_oa.data() << std::endl;

        // json unserialize
        AddressBook ab2;
        serialization::json_iarchive json_ia;
        json_ia.load_data(json_oa.data());
        serialization::unserialize(json_ia, ab2);
        std::cout << "json unserilize result: " << (ab == ab2 ? "success" : "fail") << std::endl;

        // xml serialize
        serialization::xml_oarchive xml_oa;
        serialization::serialize(xml_oa, ab);
        std::string xml_str = xml_oa.data();
        std::cout << "xml serilize result: " << xml_str << std::endl;

        // xml unserialize
        AddressBook ab3;
        serialization::xml_iarchive xml_ia;
        xml_ia.load_data(&xml_str[0]);
        serialization::unserialize(xml_ia, ab3);
        std::cout << "xml unserilize result: " << (ab == ab3 ? "success" : "fail") << std::endl;

        //test coustomize 
        Customize c{123, "456"}, c2;
        serialization::serialize(json_oa, c);
        std::cout << "customize json serilize result: " << json_oa.data() << std::endl;
        json_ia.load_data(json_oa.data());
        serialization::unserialize(json_ia, c2);
        std::cout << "customize json unserilize result: " << (c == c2 ? "success" : "fail") << std::endl;

    }
    catch (serialization::serialization_error & err)
    {
        std::cout << err.where() << ":" << err.what() << std::endl;
    }
}